

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftell.c
# Opt level: O0

long ftell(FILE *__stream)

{
  int *piVar1;
  long rc;
  _PDCLIB_file_t *stream_local;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  if (0x7fffffffffffffffU - ((long)__stream->_IO_read_base - (long)__stream->_IO_buf_base) <
      (ulong)((long)__stream->_IO_write_ptr - (long)__stream->_IO_write_base)) {
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    piVar1 = _PDCLIB_errno_func();
    *piVar1 = 0x22;
    stream_local = (_PDCLIB_file_t *)0xffffffffffffffff;
  }
  else {
    stream_local = (_PDCLIB_file_t *)
                   (__stream->_IO_write_ptr +
                   -(long)(__stream->_IO_buf_base +
                          ((int)__stream->_IO_write_base - (int)__stream->_IO_read_base)));
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  }
  return (long)stream_local;
}

Assistant:

long int ftell( struct _PDCLIB_file_t * stream )
{
    /* ftell() must take into account:
       - the actual *physical* offset of the file, i.e. the offset as recognized
         by the operating system (and stored in stream->pos.offset); and
       - any buffers held by PDCLib, which
         - in case of unwritten buffers, count in *addition* to the offset; or
         - in case of unprocessed pre-read buffers, count in *substraction* to
           the offset. (Remember to count ungetidx into this number.)
       Conveniently, the calculation ( ( bufend - bufidx ) + ungetidx ) results
       in just the right number in both cases:
         - in case of unwritten buffers, ( ( 0 - unwritten ) + 0 )
           i.e. unwritten bytes as negative number
         - in case of unprocessed pre-read, ( ( preread - processed ) + unget )
           i.e. unprocessed bytes as positive number.
       That is how the somewhat obscure return-value calculation works.
    */
    /*  If offset is too large for return type, report error instead of wrong
        offset value.
    */
    long int rc;
    _PDCLIB_LOCK( stream->mtx );

    if ( ( stream->pos.offset - stream->bufend ) > ( LONG_MAX - ( stream->bufidx - stream->ungetidx ) ) )
    {
        /* integer overflow */
        _PDCLIB_UNLOCK( stream->mtx );
        *_PDCLIB_errno_func() = _PDCLIB_ERANGE;
        return -1;
    }

    rc = ( stream->pos.offset - ( ( ( int )stream->bufend - ( int )stream->bufidx ) + stream->ungetidx ) );
    _PDCLIB_UNLOCK( stream->mtx );
    return rc;
}